

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspect.c
# Opt level: O3

void duckdb_je_inspect_extent_util_stats_get
               (tsdn_t *tsdn,void *ptr,size_t *nfree,size_t *nregs,size_t *size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  rtree_leaf_elm_t *prVar9;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar7 = (ulong)ptr & 0xffffffffc0000000;
  uVar6 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar5 = (ulong *)((long)&ctx->cache[0].leafkey + uVar6);
  uVar6 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar6);
  if (uVar6 == uVar7) {
    prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar5[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar7) {
    prVar9 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar6;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar5[1];
    *puVar5 = uVar7;
    puVar5[1] = (ulong)prVar9;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar9->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    lVar8 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar8 + -8) == uVar7) {
        uVar3 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar8);
        puVar1 = (undefined8 *)((long)ctx->cache + lVar8 + -0x18);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)ctx->cache + lVar8 + -8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        *(ulong *)((long)ctx->cache + lVar8 + -0x18) = uVar6;
        *(ulong *)((long)(ctx->cache + -1) + lVar8) = puVar5[1];
        *puVar5 = uVar7;
        puVar5[1] = uVar3;
        prVar9 = (rtree_leaf_elm_t *)(((uint)ptr >> 9 & 0x1ffff8) + uVar3);
        goto LAB_01c53fc8;
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x188);
    prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                       (tsdn,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,false);
  }
LAB_01c53fc8:
  puVar5 = (ulong *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  if (puVar5 == (ulong *)0x0) {
    *size = 0;
    *nregs = 0;
    *nfree = 0;
  }
  else {
    *size = puVar5[2] & 0xfffffffffffff000;
    if (((uint)*puVar5 >> 0xc & 1) == 0) {
      *nfree = 0;
      uVar6 = 1;
    }
    else {
      *nfree = (ulong)((uint)(*puVar5 >> 0x1c) & 0x3ff);
      uVar6 = (ulong)duckdb_je_bin_infos[(uint)*puVar5 >> 0x14 & 0xff].nregs;
    }
    *nregs = uVar6;
  }
  return;
}

Assistant:

void
inspect_extent_util_stats_get(tsdn_t *tsdn, const void *ptr, size_t *nfree,
    size_t *nregs, size_t *size) {
	assert(ptr != NULL && nfree != NULL && nregs != NULL && size != NULL);

	const edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(edata == NULL)) {
		*nfree = *nregs = *size = 0;
		return;
	}

	*size = edata_size_get(edata);
	if (!edata_slab_get(edata)) {
		*nfree = 0;
		*nregs = 1;
	} else {
		*nfree = edata_nfree_get(edata);
		*nregs = bin_infos[edata_szind_get(edata)].nregs;
		assert(*nfree <= *nregs);
		assert(*nfree * edata_usize_get(edata) <= *size);
	}
}